

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O2

void __thiscall
format_iter::format_iter(format_iter *this,char **builtin,size_t builtin_cnt,vm_val_t *custom)

{
  int iVar1;
  char *pcVar2;
  
  this->builtin = builtin;
  this->builtin_cnt = builtin_cnt;
  this->custom = custom;
  this->mode = 0;
  if ((custom == (vm_val_t *)0x0) || (custom->typ == VM_NIL)) {
    this->custom_cnt = 0;
    this->mode = 1;
  }
  else {
    pcVar2 = vm_val_t::get_as_string(custom);
    if (pcVar2 == (char *)0x0) {
      iVar1 = vm_val_t::is_listlike(custom);
      if (iVar1 == 0) {
        err_throw(0x900);
      }
      iVar1 = vm_val_t::ll_length(custom);
      this->custom_cnt = (long)iVar1;
    }
    else {
      this->custom_cnt = 1;
    }
  }
  this->bidx = 0;
  this->cidx = 0;
  return;
}

Assistant:

format_iter(VMG_ const char **builtin, size_t builtin_cnt,
                const vm_val_t *custom)
    {
        /* save the source lists */
        this->builtin = builtin;
        this->builtin_cnt = builtin_cnt;
        this->custom = custom;

        /* presume we'll start in the custom list */
        this->mode = 0;

        /* figure how many builtin items we have, if any */
        if (custom == 0 || custom->typ == VM_NIL)
        {
            /* no custom items - just use the builtin list */
            this->custom_cnt = 0;
            this->mode = 1;
        }
        else if (custom->get_as_string(vmg0_) != 0)
            this->custom_cnt = 1;
        else if (custom->is_listlike(vmg0_))
            this->custom_cnt = custom->ll_length(vmg0_);
        else
            err_throw(VMERR_BAD_TYPE_BIF);

        /* start at the top of each list */
        this->bidx = 0;
        this->cidx = 0;
    }